

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

void __thiscall QLabelPrivate::ensureTextPopulated(QLabelPrivate *this)

{
  int *piVar1;
  bool bVar2;
  undefined1 *puVar3;
  char cVar4;
  byte bVar5;
  undefined4 uVar6;
  QTextDocument *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QStringView QVar9;
  QLatin1String QVar10;
  QTextCursor cursor;
  QArrayData *local_90;
  storage_type_conflict *local_88;
  long local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x340 & 8) != 0) {
    if ((QWidgetTextControl *)this->control != (QWidgetTextControl *)0x0) {
      pQVar7 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
      if ((this->field_0x340 & 8) != 0) {
        if (this->effectiveTextFormat == MarkdownText) {
          QTextDocument::setMarkdown(pQVar7,&this->text,0x104f0c);
        }
        else if (this->effectiveTextFormat == RichText) {
          QTextDocument::setHtml((QString *)pQVar7);
        }
        else {
          QTextDocument::setPlainText((QString *)pQVar7);
        }
        uVar6 = 0;
        QTextDocument::setUndoRedoEnabled(SUB81(pQVar7,0));
        if ((this->field_0x340 & 0x20) != 0) {
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          QTextCursor::QTextCursor((QTextCursor *)&local_60);
          bVar2 = false;
          while( true ) {
            pQVar7 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
            QVar8.m_data = (storage_type *)0x1;
            QVar8.m_size = (qsizetype)&local_58;
            QString::fromLatin1(QVar8);
            local_78 = (undefined4)local_58;
            uStack_74 = local_58._4_4_;
            uStack_70 = uStack_50;
            uStack_6c = uStack_4c;
            local_68 = local_48;
            QTextDocument::find((QTextCursor *)&local_58,pQVar7,&local_78,uVar6,0);
            puVar3 = local_60;
            local_60 = local_58;
            local_58 = puVar3;
            cVar4 = QTextCursor::isNull();
            QTextCursor::~QTextCursor((QTextCursor *)&local_58);
            piVar1 = (int *)CONCAT44(uStack_74,local_78);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
              }
            }
            if (cVar4 != '\0') break;
            QTextCursor::deleteChar();
            QTextCursor::movePosition((MoveOperation)(QTextCursor *)&local_60,0x11,1);
            uVar6 = QTextCursor::position();
            if (bVar2) {
              bVar5 = 0;
            }
            else {
              QTextCursor::selectedText();
              bVar5 = 1;
              if (local_80 == 1) {
                QVar9.m_data = local_88;
                QVar9.m_size = 1;
                QVar10.m_data = "&";
                QVar10.m_size = 1;
                bVar5 = QtPrivate::equalStrings(QVar9,QVar10);
                bVar5 = bVar5 ^ 1;
              }
            }
            if ((!bVar2) && (local_90 != (QArrayData *)0x0)) {
              LOCK();
              (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_90,2,0x10);
              }
            }
            if (bVar5 != 0) {
              QTextCursor::operator=(&this->shortcutCursor,(QTextCursor *)&local_60);
              bVar2 = true;
            }
          }
          QTextCursor::~QTextCursor((QTextCursor *)&local_60);
        }
      }
    }
    this->field_0x340 = this->field_0x340 & 0xf7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::ensureTextPopulated() const
{
    if (!textDirty)
        return;
    if (control) {
        QTextDocument *doc = control->document();
        if (textDirty) {
            if (effectiveTextFormat == Qt::PlainText) {
                doc->setPlainText(text);
#if QT_CONFIG(texthtmlparser)
            } else if (effectiveTextFormat == Qt::RichText) {
                doc->setHtml(text);
#endif
#if QT_CONFIG(textmarkdownreader)
            } else if (effectiveTextFormat == Qt::MarkdownText) {
                doc->setMarkdown(text);
#endif
            } else {
                doc->setPlainText(text);
            }
            doc->setUndoRedoEnabled(false);

#ifndef QT_NO_SHORTCUT
            if (hasShortcut) {
                // Underline the first character that follows an ampersand (and remove the others ampersands)
                int from = 0;
                bool found = false;
                QTextCursor cursor;
                while (!(cursor = control->document()->find(("&"_L1), from)).isNull()) {
                    cursor.deleteChar(); // remove the ampersand
                    cursor.movePosition(QTextCursor::NextCharacter, QTextCursor::KeepAnchor);
                    from = cursor.position();
                    if (!found && cursor.selectedText() != "&"_L1) { //not a second &
                        found = true;
                        shortcutCursor = cursor;
                    }
                }
            }
#endif
        }
    }
    textDirty = false;
}